

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Complex * __thiscall Matrix<Complex>::trace(Matrix<Complex> *this)

{
  char *pcVar1;
  Complex *in_RSI;
  Complex *in_RDI;
  uint i;
  Complex *ans;
  Complex *in_stack_ffffffffffffffb8;
  Complex *this_00;
  uint local_24;
  
  if (*(int *)((long)&(in_RSI->_re)._numerator.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) ==
      *(int *)&(in_RSI->_re)._numerator.digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start) {
    this_00 = in_RDI;
    Complex::Complex(in_RSI);
    for (local_24 = 0;
        local_24 <
        (uint)(*(int *)((long)&(in_RSI->_re)._numerator.digits.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + 4) *
              *(int *)((long)&(in_RSI->_re)._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4));
        local_24 = *(int *)((long)&(in_RSI->_re)._numerator.digits.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + 4) + 1 + local_24) {
      Complex::operator+=(this_00,in_stack_ffffffffffffffb8);
    }
    return in_RDI;
  }
  pcVar1 = (char *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error((matrix_error *)in_RDI,pcVar1);
  __cxa_throw(pcVar1,&matrix_error::typeinfo,matrix_error::~matrix_error);
}

Assistant:

const Field Matrix<Field>::trace() const
{
    if(N != M)
        throw matrix_error("Trying to calculate trace of a non-square matrix");
    Field ans;
    for(unsigned i = 0; i < N * N; i += N + 1)
    {
        ans += arr[i];
    }
    return ans;
}